

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1TruncateUnsafe(PCache1 *pCache,uint iLimit)

{
  uint *puVar1;
  PCache1 *pPVar2;
  PgHdr1 *pPVar3;
  PGroup *pPVar4;
  PgHdr1 *pPVar5;
  PgHdr1 *pPVar6;
  uint uVar7;
  PgHdr1 **ppPVar8;
  PgHdr1 **ppPVar9;
  ulong uVar10;
  
  uVar7 = pCache->nHash;
  if (uVar7 != 0) {
    uVar10 = 0;
    do {
      pPVar6 = pCache->apHash[uVar10];
      if (pPVar6 != (PgHdr1 *)0x0) {
        ppPVar9 = pCache->apHash + uVar10;
        do {
          if (pPVar6->iKey < iLimit) {
            ppPVar9 = &pPVar6->pNext;
          }
          else {
            pCache->nPage = pCache->nPage - 1;
            *ppPVar9 = pPVar6->pNext;
            if (pPVar6->isPinned == '\0') {
              pPVar2 = pPVar6->pCache;
              pPVar3 = pPVar6->pLruNext;
              pPVar4 = pPVar2->pGroup;
              pPVar5 = pPVar6->pLruPrev;
              ppPVar8 = &pPVar5->pLruNext;
              if (pPVar5 == (PgHdr1 *)0x0) {
                ppPVar8 = &pPVar4->pLruHead;
              }
              *ppPVar8 = pPVar3;
              ppPVar8 = &pPVar3->pLruPrev;
              if (pPVar3 == (PgHdr1 *)0x0) {
                ppPVar8 = &pPVar4->pLruTail;
              }
              *ppPVar8 = pPVar5;
              pPVar6->pLruNext = (PgHdr1 *)0x0;
              pPVar6->pLruPrev = (PgHdr1 *)0x0;
              pPVar6->isPinned = '\x01';
              puVar1 = &pPVar2->nRecyclable;
              *puVar1 = *puVar1 - 1;
            }
            pPVar2 = pPVar6->pCache;
            pcache1Free((pPVar6->page).pBuf);
            if (pPVar2->bPurgeable != 0) {
              puVar1 = &pPVar2->pGroup->nCurrentPage;
              *puVar1 = *puVar1 - 1;
            }
          }
          pPVar6 = *ppPVar9;
        } while (pPVar6 != (PgHdr1 *)0x0);
        uVar7 = pCache->nHash;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar7);
  }
  return;
}

Assistant:

static void pcache1TruncateUnsafe(
  PCache1 *pCache,             /* The cache to truncate */
  unsigned int iLimit          /* Drop pages with this pgno or larger */
){
  TESTONLY( unsigned int nPage = 0; )  /* To assert pCache->nPage is correct */
  unsigned int h;
  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  for(h=0; h<pCache->nHash; h++){
    PgHdr1 **pp = &pCache->apHash[h]; 
    PgHdr1 *pPage;
    while( (pPage = *pp)!=0 ){
      if( pPage->iKey>=iLimit ){
        pCache->nPage--;
        *pp = pPage->pNext;
        if( !pPage->isPinned ) pcache1PinPage(pPage);
        pcache1FreePage(pPage);
      }else{
        pp = &pPage->pNext;
        TESTONLY( nPage++; )
      }
    }
  }
  assert( pCache->nPage==nPage );
}